

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImVec2 frame_padding,
               char *label,ImGuiID tab_id,ImGuiID close_button_id)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  ImGuiID IVar8;
  ImGuiItemStatusFlags IVar9;
  ImGuiContext *pIVar10;
  bool bVar11;
  bool bVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar13;
  float fVar14;
  float local_c8;
  float fStack_c4;
  ImVec2 local_80;
  ImVec2 label_size;
  ImVec2 frame_padding_local;
  ImVec2 unsaved_marker_pos;
  ImVec2 local_60;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ImVec2 local_38;
  
  pIVar10 = GImGui;
  bVar11 = false;
  frame_padding_local = frame_padding;
  label_size = CalcTextSize(label,(char *)0x0,true,-1.0);
  fVar14 = (bb->Min).x;
  fVar13 = (bb->Max).x;
  if (1.0 < fVar13 - fVar14) {
    fVar1 = (bb->Min).y;
    local_c8 = frame_padding.x;
    fStack_c4 = frame_padding.y;
    fVar13 = fVar13 - local_c8;
    fVar2 = (bb->Max).y;
    if ((flags & 1U) != 0) {
      local_48 = fStack_c4;
      fStack_44 = fStack_c4;
      fStack_40 = fStack_c4;
      fStack_3c = fStack_c4;
      local_58._8_4_ = extraout_XMM0_Dc;
      local_58._0_4_ = label_size.x;
      local_58._4_4_ = label_size.y;
      local_58._12_4_ = extraout_XMM0_Dd;
      IVar4 = CalcTextSize("*",(char *)0x0,false,-1.0);
      fVar13 = fVar13 - IVar4.x;
      unsaved_marker_pos.x = (bb->Min).x + local_c8 + (float)local_58._0_4_ + 2.0;
      if (fVar13 <= unsaved_marker_pos.x) {
        unsaved_marker_pos.x = fVar13;
      }
      unsaved_marker_pos.y = (float)(int)(pIVar10->FontSize * -0.25) + local_48 + (bb->Min).y;
      local_80.y = (bb->Max).y - fStack_c4;
      local_80.x = (bb->Max).x - local_c8;
      local_38.x = 0.0;
      local_38.y = 0.0;
      RenderTextClippedEx(draw_list,&unsaved_marker_pos,&local_80,"*",(char *)0x0,(ImVec2 *)0x0,
                          &local_38,(ImRect *)0x0);
    }
    unsaved_marker_pos.y = fVar1 + fStack_c4;
    unsaved_marker_pos.x = fVar14 + local_c8;
    local_60.x = fVar13;
    local_60.y = fVar2;
    if ((close_button_id == 0) ||
       ((pIVar10->HoveredId != close_button_id && pIVar10->HoveredId != tab_id &&
        (pIVar10->ActiveId != close_button_id)))) {
      fVar14 = (bb->Max).x + -1.0;
      bVar11 = false;
    }
    else {
      pIVar3 = GImGui->CurrentWindow;
      fVar14 = pIVar10->FontSize;
      IVar4 = (pIVar3->DC).LastItemRect.Min;
      IVar5 = (pIVar3->DC).LastItemRect.Max;
      IVar6 = (pIVar3->DC).LastItemDisplayRect.Min;
      IVar7 = (pIVar3->DC).LastItemDisplayRect.Max;
      IVar8 = (pIVar3->DC).LastItemId;
      IVar9 = (pIVar3->DC).LastItemStatusFlags;
      PushStyleVar(10,&frame_padding_local);
      local_80.y = (bb->Min).y;
      local_80.x = ((bb->Max).x - (frame_padding_local.x + frame_padding_local.x)) - fVar14;
      bVar11 = CloseButton(close_button_id,&local_80);
      PopStyleVar(1);
      pIVar3 = GImGui->CurrentWindow;
      (pIVar3->DC).LastItemId = IVar8;
      (pIVar3->DC).LastItemStatusFlags = IVar9;
      (pIVar3->DC).LastItemRect.Min = IVar4;
      (pIVar3->DC).LastItemRect.Max = IVar5;
      (pIVar3->DC).LastItemDisplayRect.Min = IVar6;
      (pIVar3->DC).LastItemDisplayRect.Max = IVar7;
      if ((flags & 4U) == 0) {
        bVar12 = IsMouseClicked(2,false);
        bVar11 = bVar11 || bVar12;
      }
      fVar14 = fVar13 - fVar14;
      fVar13 = fVar14;
    }
    RenderTextEllipsis(draw_list,&unsaved_marker_pos,&local_60,fVar13,fVar14,label,(char *)0x0,
                       &label_size);
  }
  return bVar11;
}

Assistant:

bool ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImVec2 frame_padding, const char* label, ImGuiID tab_id, ImGuiID close_button_id)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (bb.GetWidth() <= 1.0f)
        return false;

    // Render text label (with clipping + alpha gradient) + unsaved marker
    const char* TAB_UNSAVED_MARKER = "*";
    ImRect text_pixel_clip_bb(bb.Min.x + frame_padding.x, bb.Min.y + frame_padding.y, bb.Max.x - frame_padding.x, bb.Max.y);
    if (flags & ImGuiTabItemFlags_UnsavedDocument)
    {
        text_pixel_clip_bb.Max.x -= CalcTextSize(TAB_UNSAVED_MARKER, NULL, false).x;
        ImVec2 unsaved_marker_pos(ImMin(bb.Min.x + frame_padding.x + label_size.x + 2, text_pixel_clip_bb.Max.x), bb.Min.y + frame_padding.y + IM_FLOOR(-g.FontSize * 0.25f));
        RenderTextClippedEx(draw_list, unsaved_marker_pos, bb.Max - frame_padding, TAB_UNSAVED_MARKER, NULL, NULL);
    }
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Close Button
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == close_button_id)
            close_button_visible = true;
    if (close_button_visible)
    {
        ImGuiItemHoveredDataBackup last_item_backup;
        const float close_button_sz = g.FontSize;
        PushStyleVar(ImGuiStyleVar_FramePadding, frame_padding);
        if (CloseButton(close_button_id, ImVec2(bb.Max.x - frame_padding.x * 2.0f - close_button_sz, bb.Min.y)))
            close_button_pressed = true;
        PopStyleVar();
        last_item_backup.Restore();

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;

        text_pixel_clip_bb.Max.x -= close_button_sz;
    }

    float ellipsis_max_x = close_button_visible ? text_pixel_clip_bb.Max.x : bb.Max.x - 1.0f;
    RenderTextEllipsis(draw_list, text_ellipsis_clip_bb.Min, text_ellipsis_clip_bb.Max, text_pixel_clip_bb.Max.x, ellipsis_max_x, label, NULL, &label_size);

    return close_button_pressed;
}